

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O2

bool __thiscall
CxxModuleUsage::AddReference(CxxModuleUsage *this,string *logical,string *loc,LookupMethod method)

{
  __type _Var1;
  bool bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  LookupMethod m;
  string local_d0;
  string_view local_b0;
  string_view local_a0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  string *psVar5;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
          ::find(&(this->Reference)._M_t,logical);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->Reference)._M_t._M_impl.super__Rb_tree_header) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
             ::operator[](&this->Reference,logical);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar4->Method = method;
    bVar2 = true;
  }
  else {
    psVar5 = loc;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar3._M_node + 2),loc);
    m = (LookupMethod)psVar5;
    bVar2 = true;
    if (!_Var1 || iVar3._M_node[3]._M_color != method) {
      local_60.View_._M_len = 0x25;
      local_60.View_._M_str = "Disagreement of the location of the \'";
      local_90.View_._M_str = (logical->_M_dataplus)._M_p;
      local_90.View_._M_len = logical->_M_string_length;
      local_a0 = (string_view)
                 AddReference::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)(ulong)iVar3._M_node[3]._M_color,m);
      local_b0 = (string_view)
                 AddReference::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)(ulong)method,m);
      cmStrCat<char[24],std::__cxx11::string,char[7],cm::static_string_view,char[16],std::__cxx11::string,char[7],cm::static_string_view,char[2]>
                (&local_d0,&local_60,&local_90,(char (*) [24])"\' module. Location A: \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (iVar3._M_node + 2),(char (*) [7])"\' via ",(static_string_view *)&local_a0,
                 (char (*) [16])"; Location B: \'",loc,(char (*) [7])"\' via ",
                 (static_string_view *)&local_b0,(char (*) [2])0x59ee35);
      cmSystemTools::Error(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool CxxModuleUsage::AddReference(std::string const& logical,
                                  std::string const& loc, LookupMethod method)
{
  auto r = this->Reference.find(logical);
  if (r != this->Reference.end()) {
    auto& ref = r->second;

    if (ref.Path == loc && ref.Method == method) {
      return true;
    }

    auto method_name = [](LookupMethod m) -> cm::static_string_view {
      switch (m) {
        case LookupMethod::ByName:
          return "by-name"_s;
        case LookupMethod::IncludeAngle:
          return "include-angle"_s;
        case LookupMethod::IncludeQuote:
          return "include-quote"_s;
      }
      assert(false && "unsupported lookup method");
      return ""_s;
    };

    cmSystemTools::Error(cmStrCat("Disagreement of the location of the '",
                                  logical,
                                  "' module. "
                                  "Location A: '",
                                  ref.Path, "' via ", method_name(ref.Method),
                                  "; "
                                  "Location B: '",
                                  loc, "' via ", method_name(method), "."));
    return false;
  }

  auto& ref = this->Reference[logical];
  ref.Path = loc;
  ref.Method = method;

  return true;
}